

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writeHeader(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  bool bVar2;
  QTextStream *pQVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  ProKey local_98;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<
            (t,"#############################################################################\n");
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Makefile for building: ");
  ProKey::ProKey(&local_98,"TARGET");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_68,this,&local_98);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_50,this,&local_68);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_50);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QTextStream::operator<<(t,"# Generated by qmake (3.1) (Qt 6.10.0)\n");
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Project:  ");
  pQVar1 = this->project;
  local_50.d = (pQVar1->m_projectFile).d.d;
  local_50.ptr = (pQVar1->m_projectFile).d.ptr;
  local_50.size = (pQVar1->m_projectFile).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  fileFixify((QString *)&local_98,this,(QString *)&local_50,(FileFixifyTypes)0x0,true);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_98);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Template: ");
  ProKey::ProKey(&local_98,"TEMPLATE");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_50,this,&local_98);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_50);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  pQVar1 = this->project;
  QString::QString((QString *)&local_98,"build_pass");
  bVar2 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_98,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (!bVar2) {
    pQVar3 = (QTextStream *)QTextStream::operator<<(t,"# Command: ");
    ProKey::ProKey(&local_98,"QMAKE_QMAKE");
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_50,this,&local_98);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_50);
    fullBuildArgs((QString *)&local_68,this);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_68);
    Qt::endl(pQVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  QTextStream::operator<<
            (t,"#############################################################################\n");
  Qt::endl(t);
  local_98.super_ProString.m_string.d.size = -0x5555555555555556;
  local_98.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_98.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  Option::fixPathToTargetOS((QString *)&local_98,(QString *)&local_50,true,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  qVar4 = QString::lastIndexOf((QString *)&local_98,&Option::dir_sep,CaseSensitive);
  if (qVar4 != -1) {
    QString::lastIndexOf((QString *)&local_98,&Option::dir_sep,CaseSensitive);
    QString::remove((longlong)&local_98,0);
  }
  pQVar3 = (QTextStream *)QTextStream::operator<<(t,"MAKEFILE      = ");
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])(&local_50,this,&local_98);
  pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_50);
  pQVar3 = (QTextStream *)Qt::endl(pQVar3);
  Qt::endl(pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QTextStream::operator<<(t,"EQ            = =\n\n");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeHeader(QTextStream &t)
{
    t << "#############################################################################\n";
    t << "# Makefile for building: " << escapeFilePath(var("TARGET")) << Qt::endl;
    t << "# Generated by qmake (" QMAKE_VERSION_STR ") (Qt " QT_VERSION_STR ")\n";
    t << "# Project:  " << fileFixify(project->projectFile()) << Qt::endl;
    t << "# Template: " << var("TEMPLATE") << Qt::endl;
    if(!project->isActiveConfig("build_pass"))
        t << "# Command: " << var("QMAKE_QMAKE") << fullBuildArgs() << Qt::endl;
    t << "#############################################################################\n";
    t << Qt::endl;
    QString ofile = Option::fixPathToTargetOS(Option::output.fileName());
    if (ofile.lastIndexOf(Option::dir_sep) != -1)
        ofile.remove(0, ofile.lastIndexOf(Option::dir_sep) +1);
    t << "MAKEFILE      = " << escapeFilePath(ofile) << Qt::endl << Qt::endl;
    t << "EQ            = =\n\n";
}